

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_eciwx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 EA;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  gen_set_access_type(ctx,0x50);
  EA = tcg_temp_new_i64(tcg_ctx_00);
  gen_addr_reg_index(ctx,EA);
  uVar1 = rD(ctx->opcode);
  tcg_gen_qemu_ld_i64_ppc64
            (tcg_ctx_00,cpu_gpr[uVar1],EA,(long)ctx->mem_idx,
             ctx->default_tcg_memop_mask | (MO_ALIGN|MO_32));
  tcg_temp_free_i64(tcg_ctx_00,EA);
  return;
}

Assistant:

static void gen_eciwx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    /* Should check EAR[E] ! */
    gen_set_access_type(ctx, ACCESS_EXT);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    tcg_gen_qemu_ld_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0, ctx->mem_idx,
                       DEF_MEMOP(MO_UL | MO_ALIGN));
    tcg_temp_free(tcg_ctx, t0);
}